

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O2

exr_result_t internal_exr_write_header(exr_context_t ctxt)

{
  exr_priv_part_t p_Var1;
  exr_attribute_t *a_00;
  char *__s1;
  exr_result_t eVar2;
  int iVar3;
  int a;
  long lVar4;
  uint8_t next_byte;
  uint64_t *local_50;
  long local_48;
  uint32_t flags;
  uint32_t magic_and_version [2];
  
  internal_exr_calc_header_version_flags(ctxt,&flags);
  magic_and_version[0] = 0x1312f76;
  magic_and_version[1] = flags;
  local_50 = &ctxt->output_file_offset;
  eVar2 = (*ctxt->do_write)(ctxt,magic_and_version,8,local_50);
  if (eVar2 == 0) {
    lVar4 = 0;
    eVar2 = 0;
    while (eVar2 == 0) {
      if (ctxt->num_parts <= lVar4) {
        if (ctxt->is_multipart != '\0') {
          next_byte = '\0';
          eVar2 = (*ctxt->do_write)(ctxt,&next_byte,1,local_50);
          return eVar2;
        }
        return 0;
      }
      p_Var1 = ctxt->parts[lVar4];
      local_48 = lVar4;
      if (ctxt->legacy_header == '\0') {
        lVar4 = 0;
        do {
          if ((p_Var1->attributes).num_attributes <= lVar4) goto LAB_00122950;
          eVar2 = save_attr(ctxt,(p_Var1->attributes).entries[lVar4]);
          lVar4 = lVar4 + 1;
        } while (eVar2 == 0);
      }
      else {
        for (lVar4 = 0; lVar4 < (p_Var1->attributes).num_attributes; lVar4 = lVar4 + 1) {
          a_00 = (p_Var1->attributes).sorted_entries[lVar4];
          if (((flags & 0x1800) == 0) && (ctxt->num_parts == 1)) {
            __s1 = a_00->name;
            iVar3 = strcmp(__s1,"type");
            if ((iVar3 != 0) && (iVar3 = strcmp(__s1,"name"), iVar3 != 0)) goto LAB_00122917;
          }
          else {
LAB_00122917:
            eVar2 = save_attr(ctxt,a_00);
            if (eVar2 != 0) goto LAB_00122968;
          }
        }
LAB_00122950:
        next_byte = '\0';
        eVar2 = (*ctxt->do_write)(ctxt,&next_byte,1,local_50);
      }
LAB_00122968:
      lVar4 = local_48 + 1;
    }
  }
  return eVar2;
}

Assistant:

exr_result_t
internal_exr_write_header (exr_context_t ctxt)
{
    exr_result_t rv;
    uint32_t     magic_and_version[2];
    uint32_t     flags;
    uint8_t      next_byte;

    rv = internal_exr_calc_header_version_flags (ctxt, &flags);

    magic_and_version[0] = 20000630;
    magic_and_version[1] = flags;

    priv_from_native32 (magic_and_version, 2);

    rv = ctxt->do_write (
        ctxt,
        magic_and_version,
        sizeof (uint32_t) * 2,
        &(ctxt->output_file_offset));
    if (rv != EXR_ERR_SUCCESS) return rv;

    for (int p = 0; rv == EXR_ERR_SUCCESS && p < ctxt->num_parts; ++p)
    {
        exr_priv_part_t curp = ctxt->parts[p];
        if (ctxt->legacy_header)
        {
            for (int a = 0; a < curp->attributes.num_attributes; ++a)
            {
                exr_attribute_t* curattr = curp->attributes.sorted_entries[a];
                if (0 == (flags & (EXR_MULTI_PART_FLAG | EXR_NON_IMAGE_FLAG)) &&
                    1 == ctxt->num_parts)
                {
                    if (0 == strcmp (curattr->name, "type") ||
                        0 == strcmp (curattr->name, "name"))
                    {
                        /* old file wouldn't have had this */
                        continue;
                    }
                }
                rv = save_attr (ctxt, curattr);
                if (rv != EXR_ERR_SUCCESS) break;
            }
        }
        else
        {
            for (int a = 0; a < curp->attributes.num_attributes; ++a)
            {
                rv = save_attr (ctxt, curp->attributes.entries[a]);
                if (rv != EXR_ERR_SUCCESS) break;
            }
        }

        /* indicate this part is finished */
        if (rv == EXR_ERR_SUCCESS)
        {
            next_byte = 0;
            rv        = ctxt->do_write (
                ctxt,
                &next_byte,
                sizeof (uint8_t),
                &(ctxt->output_file_offset));
        }
    }

    /* for multipart write a double terminator at the end */
    if (rv == EXR_ERR_SUCCESS && ctxt->is_multipart)
    {
        next_byte = 0;
        rv        = ctxt->do_write (
            ctxt, &next_byte, sizeof (uint8_t), &(ctxt->output_file_offset));
    }

    return rv;
}